

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O1

void __thiscall OpenMPClause::addLangExpr(OpenMPClause *this,char *expression,int line,int col)

{
  pointer *pppcVar1;
  pointer *ppSVar2;
  pointer ppcVar3;
  iterator __position;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  SourceLocation local_50;
  iterator local_40;
  char *local_38;
  
  ppcVar3 = (this->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_40._M_current =
       (this->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar7 = (long)local_40._M_current - (long)ppcVar3;
  bVar9 = lVar7 != 0;
  local_38 = expression;
  if (bVar9) {
    iVar4 = strcmp(*ppcVar3,expression);
    if (iVar4 != 0) {
      uVar8 = lVar7 >> 3;
      uVar5 = 1;
      do {
        uVar6 = (ulong)uVar5;
        bVar9 = uVar6 < uVar8;
        if (uVar8 <= uVar6) goto LAB_00180a33;
        iVar4 = strcmp(ppcVar3[uVar6],expression);
        uVar5 = uVar5 + 1;
      } while (iVar4 != 0);
    }
    if (bVar9) {
      return;
    }
  }
LAB_00180a33:
  if (local_40._M_current ==
      (this->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->expressions,local_40,
               &local_38);
  }
  else {
    *local_40._M_current = expression;
    pppcVar1 = &(this->expressions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  local_50.parent_construct = (SourceLocation *)0x0;
  __position._M_current =
       (this->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_50.line = line;
    local_50.column = col;
    std::vector<SourceLocation,_std::allocator<SourceLocation>_>::_M_realloc_insert<SourceLocation>
              (&this->locations,__position,&local_50);
  }
  else {
    (__position._M_current)->line = line;
    (__position._M_current)->column = col;
    (__position._M_current)->parent_construct = (SourceLocation *)0x0;
    ppSVar2 = &(this->locations).super__Vector_base<SourceLocation,_std::allocator<SourceLocation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar2 = *ppSVar2 + 1;
  }
  return;
}

Assistant:

void OpenMPClause::addLangExpr(const char *expression, int line, int col) {
    // Since the size of expression vector is supposed to be small, brute force is used here.
    for (unsigned int i = 0; i < this->expressions.size(); i++) {
        if (!strcmp(expressions.at(i), expression)) {
            return;
        };
    };
    expressions.push_back(expression);
    locations.push_back(SourceLocation(line, col));
}